

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_to_revision.cpp
# Opt level: O2

maybe<unsigned_int,_void> *
pstore::str_to_revision(maybe<unsigned_int,_void> *__return_storage_ptr__,string *str)

{
  _Alloc_hider _Var1;
  bool bVar2;
  ulong uVar3;
  _Iter_negate<(anonymous_namespace)::trim_and_lowercase(std::__cxx11::string_const&)::__0> *p_Var4;
  size_type sVar5;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __it;
  long lVar6;
  long lVar7;
  _Iter_negate<(anonymous_namespace)::trim_and_lowercase(std::__cxx11::string_const&)::__0> *p_Var8;
  _Iter_negate<(anonymous_namespace)::trim_and_lowercase(std::__cxx11::string_const&)::__0> *p_Var9;
  char *endptr;
  string arg;
  _Iter_negate<(anonymous_namespace)::trim_and_lowercase(std::__cxx11::string_const&)::__0>
  *local_58;
  _Iter_negate<(anonymous_namespace)::trim_and_lowercase(std::__cxx11::string_const&)::__0>
  *local_50;
  _Iter_negate<(anonymous_namespace)::trim_and_lowercase(std::__cxx11::string_const&)::__0>
  *local_48;
  _Iter_negate<(anonymous_namespace)::trim_and_lowercase(std::__cxx11::string_const&)::__0>
  *local_40;
  _Iter_negate<(anonymous_namespace)::trim_and_lowercase(std::__cxx11::string_const&)::__0>
  *local_38;
  
  p_Var8 = (_Iter_negate<(anonymous_namespace)::trim_and_lowercase(std::__cxx11::string_const&)::__0>
            *)(str->_M_dataplus)._M_p;
  sVar5 = str->_M_string_length;
  __it._M_current = (char *)str;
  for (lVar6 = (long)sVar5 >> 2; p_Var9 = p_Var8 + sVar5, p_Var4 = p_Var9, 0 < lVar6;
      lVar6 = lVar6 + -1) {
    arg._M_dataplus._M_p = (pointer)p_Var9;
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<(anonymous_namespace)::trim_and_lowercase(std::__cxx11::string_const&)::$_0>
            ::operator()((_Iter_negate<(anonymous_namespace)::trim_and_lowercase(std::__cxx11::string_const&)::__0>
                          *)&arg,(reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)__it._M_current);
    if (bVar2) goto LAB_00119bc5;
    endptr = (char *)(p_Var8 + (sVar5 - 1));
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<(anonymous_namespace)::trim_and_lowercase(std::__cxx11::string_const&)::$_0>
            ::operator()((_Iter_negate<(anonymous_namespace)::trim_and_lowercase(std::__cxx11::string_const&)::__0>
                          *)&endptr,
                         (reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)__it._M_current);
    p_Var4 = p_Var8 + (sVar5 - 1);
    if (bVar2) goto LAB_00119bc5;
    local_50 = p_Var8 + (sVar5 - 2);
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<(anonymous_namespace)::trim_and_lowercase(std::__cxx11::string_const&)::$_0>
            ::operator()((_Iter_negate<(anonymous_namespace)::trim_and_lowercase(std::__cxx11::string_const&)::__0>
                          *)&local_50,
                         (reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)__it._M_current);
    p_Var4 = p_Var8 + (sVar5 - 2);
    if (bVar2) goto LAB_00119bc5;
    local_58 = p_Var8 + (sVar5 - 3);
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<(anonymous_namespace)::trim_and_lowercase(std::__cxx11::string_const&)::$_0>
            ::operator()((_Iter_negate<(anonymous_namespace)::trim_and_lowercase(std::__cxx11::string_const&)::__0>
                          *)&local_58,
                         (reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)__it._M_current);
    p_Var4 = p_Var8 + (sVar5 - 3);
    if (bVar2) goto LAB_00119bc5;
    sVar5 = sVar5 - 4;
  }
  if (sVar5 == 3) {
    local_38 = p_Var9;
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<(anonymous_namespace)::trim_and_lowercase(std::__cxx11::string_const&)::$_0>
            ::operator()((_Iter_negate<(anonymous_namespace)::trim_and_lowercase(std::__cxx11::string_const&)::__0>
                          *)&local_38,
                         (reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)__it._M_current);
    if (!bVar2) {
      p_Var9 = p_Var8 + 2;
      goto LAB_00119d63;
    }
  }
  else {
    if (sVar5 == 2) {
LAB_00119d63:
      local_40 = p_Var9;
      bVar2 = __gnu_cxx::__ops::
              _Iter_negate<(anonymous_namespace)::trim_and_lowercase(std::__cxx11::string_const&)::$_0>
              ::operator()((_Iter_negate<(anonymous_namespace)::trim_and_lowercase(std::__cxx11::string_const&)::__0>
                            *)&local_40,
                           (reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)__it._M_current);
      p_Var4 = p_Var9;
      if (bVar2) goto LAB_00119bc5;
      p_Var9 = p_Var9 + -1;
    }
    else {
      p_Var4 = p_Var8;
      if (sVar5 != 1) goto LAB_00119bc5;
    }
    local_48 = p_Var9;
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<(anonymous_namespace)::trim_and_lowercase(std::__cxx11::string_const&)::$_0>
            ::operator()((_Iter_negate<(anonymous_namespace)::trim_and_lowercase(std::__cxx11::string_const&)::__0>
                          *)&local_48,
                         (reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)__it._M_current);
    p_Var4 = p_Var8;
    if (bVar2) {
      p_Var4 = p_Var9;
    }
  }
LAB_00119bc5:
  p_Var8 = (_Iter_negate<(anonymous_namespace)::trim_and_lowercase(std::__cxx11::string_const&)::__0>
            *)(str->_M_dataplus)._M_p;
  lVar6 = (long)p_Var4 - (long)p_Var8;
  for (lVar7 = lVar6 >> 2; 0 < lVar7; lVar7 = lVar7 + -1) {
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<(anonymous_namespace)::trim_and_lowercase(std::__cxx11::string_const&)::$_0>
            ::operator()(p_Var8,__it);
    p_Var9 = p_Var8;
    if (bVar2) goto LAB_00119c67;
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<(anonymous_namespace)::trim_and_lowercase(std::__cxx11::string_const&)::$_0>
            ::operator()(p_Var8 + 1,__it);
    p_Var9 = p_Var8 + 1;
    if (bVar2) goto LAB_00119c67;
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<(anonymous_namespace)::trim_and_lowercase(std::__cxx11::string_const&)::$_0>
            ::operator()(p_Var8 + 2,__it);
    p_Var9 = p_Var8 + 2;
    if (bVar2) goto LAB_00119c67;
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<(anonymous_namespace)::trim_and_lowercase(std::__cxx11::string_const&)::$_0>
            ::operator()(p_Var8 + 3,__it);
    p_Var9 = p_Var8 + 3;
    if (bVar2) goto LAB_00119c67;
    p_Var8 = p_Var8 + 4;
    lVar6 = lVar6 + -4;
  }
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      p_Var9 = p_Var4;
      if ((lVar6 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_negate<(anonymous_namespace)::trim_and_lowercase(std::__cxx11::string_const&)::$_0>
                  ::operator()(p_Var8,__it), p_Var9 = p_Var8, bVar2)) goto LAB_00119c67;
      p_Var8 = p_Var8 + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<(anonymous_namespace)::trim_and_lowercase(std::__cxx11::string_const&)::$_0>
            ::operator()(p_Var8,__it);
    p_Var9 = p_Var8;
    if (bVar2) goto LAB_00119c67;
    p_Var8 = p_Var8 + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_negate<(anonymous_namespace)::trim_and_lowercase(std::__cxx11::string_const&)::$_0>
          ::operator()(p_Var8,__it);
  p_Var9 = p_Var8;
  if (!bVar2) {
    p_Var9 = p_Var4;
  }
LAB_00119c67:
  arg._M_dataplus._M_p = (pointer)&arg.field_2;
  arg._M_string_length = 0;
  arg.field_2._M_local_buf[0] = '\0';
  unsigned_cast<long,unsigned_long,void>((long)p_Var4 - (long)p_Var9);
  std::__cxx11::string::reserve((ulong)&arg);
  for (; p_Var9 != p_Var4; p_Var9 = p_Var9 + 1) {
    tolower((int)(char)*p_Var9);
    std::__cxx11::string::push_back((char)&arg);
  }
  bVar2 = std::operator==(&arg,"head");
  _Var1 = arg._M_dataplus;
  if (bVar2) {
    __return_storage_ptr__->valid_ = true;
    __return_storage_ptr__->storage_ = (type)0xffffffff;
  }
  else {
    endptr = (char *)0x0;
    uVar3 = strtol(arg._M_dataplus._M_p,&endptr,10);
    if ((endptr == _Var1._M_p) || (0xfffffffe < uVar3 || *endptr != '\0')) {
      __return_storage_ptr__->valid_ = false;
      *(undefined3 *)&__return_storage_ptr__->field_0x1 = 0;
      __return_storage_ptr__->storage_ = (type)0x0;
    }
    else {
      __return_storage_ptr__->valid_ = true;
      __return_storage_ptr__->storage_ = SUB84(uVar3,0);
    }
  }
  std::__cxx11::string::~string((string *)&arg);
  return __return_storage_ptr__;
}

Assistant:

maybe<unsigned> str_to_revision (std::string const & str) {
        std::string const arg = trim_and_lowercase (str);
        if (arg == "head") {
            return just (head_revision);
        }

        gsl::czstring const cstr = arg.c_str ();
        char * endptr = nullptr;
        long const revision = std::strtol (cstr, &endptr, 10);

        // strtol() returns LONG_MAX or LONG_MIN to indicate an overflow. endptr must point to
        // the terminating null character to ensure that the entire string was consumed. We also
        // check that revision lies within the range of numbers that we can safely represent.
        if (endptr != cstr && *endptr == '\0' && revision != LONG_MAX && revision != LONG_MIN &&
            revision >= 0 && revision != head_revision &&
            static_cast<unsigned long> (revision) < std::numeric_limits<unsigned>::max ()) {

            return just (static_cast<unsigned> (revision));
        }

        return nothing<unsigned> ();
    }